

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void sellobj(obj *obj,xchar x,xchar y)

{
  int iVar1;
  int iVar2;
  level *lev;
  boolean bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  monst *mtmp;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  char *local_350;
  char *local_300;
  boolean short_funds;
  long shkmoney;
  char qbuf_1 [256];
  long tmpcr;
  char qbuf [256];
  char local_69;
  char c;
  long delta;
  boolean unpaid;
  boolean only_partially_your_contents;
  boolean isgold;
  boolean container;
  boolean cgold;
  long lStack_58;
  boolean saleitem;
  long offer;
  long gltmp;
  long cltmp;
  long ltmp;
  eshk *eshkp;
  monst *shkp;
  xchar y_local;
  xchar x_local;
  obj *obj_local;
  
  lev = level;
  cltmp = 0;
  gltmp = 0;
  offer = 0;
  delta._6_1_ = false;
  bVar14 = obj->cobj != (obj *)0x0;
  bVar15 = obj->oclass == '\f';
  bVar16 = false;
  pcVar6 = in_rooms(level,x,y,0x12);
  mtmp = shop_keeper(lev,*pcVar6);
  if ((((mtmp != (monst *)0x0) && (iVar5 = inhishop(mtmp), iVar5 != 0)) &&
      (bVar3 = costly_spot(x,y), bVar3 != '\0')) && (u.ushops[0] != '\0')) {
    if ((((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) || (bVar14)) || (bVar15)) {
      if (bVar14) {
        gltmp = contained_cost(obj,mtmp,0,'\x01','\0');
        offer = contained_gold(obj);
        delta._6_1_ = 0 < offer;
      }
      bVar3 = saleable(mtmp,obj);
      if (((!bVar15) && ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0)) && (bVar3 != '\0')) {
        cltmp = set_cost(obj,mtmp);
      }
      lStack_58 = cltmp + gltmp;
      if (((bVar15) || (delta._6_1_ != false)) || ((lStack_58 + offer != 0 && (sell_how != 2)))) {
        rouse_shk(mtmp,'\x01');
        if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
          pline("Thank you, scum!");
          subfrombill(obj,mtmp);
        }
        else {
          iVar5._0_1_ = mtmp[0x1b].mtame;
          iVar5._1_1_ = mtmp[0x1b].m_ap_type;
          iVar5._2_1_ = mtmp[0x1b].mfrozen;
          iVar5._3_1_ = mtmp[0x1b].mblinded;
          if (iVar5 == 0) {
            if ((bVar15) || (delta._6_1_ != false)) {
              if (delta._6_1_ == false) {
                offer = (long)obj->quan;
              }
              if (*(int *)&mtmp[0x1b].field_0x60 < offer) {
                lVar7 = offer - *(int *)&mtmp[0x1b].field_0x60;
                mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + (int)lVar7;
                if (*(int *)&mtmp[0x1b].field_0x60 != 0) {
                  *(undefined4 *)&mtmp[0x1b].field_0x60 = 0;
                  mtmp[0x1b].mfleetim = '\0';
                  mtmp[0x1b].wormno = '\0';
                  mtmp[0x1b].weapon_check = '\0';
                  mtmp[0x1b].field_0x67 = 0;
                  pline("Your debt is paid off.");
                }
                pcVar6 = currency(lVar7);
                pcVar13 = "is";
                if (1 < lVar7) {
                  pcVar13 = "are";
                }
                pline("%ld %s %s added to your credit.",lVar7,pcVar6,pcVar13);
              }
              else {
                iVar1._0_1_ = mtmp[0x1b].mfleetim;
                iVar1._1_1_ = mtmp[0x1b].wormno;
                iVar1._2_1_ = mtmp[0x1b].weapon_check;
                iVar1._3_1_ = mtmp[0x1b].field_0x67;
                if (iVar1 != 0) {
                  iVar2._0_1_ = mtmp[0x1b].mfleetim;
                  iVar2._1_1_ = mtmp[0x1b].wormno;
                  iVar2._2_1_ = mtmp[0x1b].weapon_check;
                  iVar2._3_1_ = mtmp[0x1b].field_0x67;
                  if (iVar2 < offer) {
                    mtmp[0x1b].mfleetim = '\0';
                    mtmp[0x1b].wormno = '\0';
                    mtmp[0x1b].weapon_check = '\0';
                    mtmp[0x1b].field_0x67 = 0;
                  }
                  else {
                    *(int *)&mtmp[0x1b].mfleetim = *(int *)&mtmp[0x1b].mfleetim - (int)offer;
                  }
                }
                *(int *)&mtmp[0x1b].field_0x60 = *(int *)&mtmp[0x1b].field_0x60 - (int)offer;
                pcVar6 = "";
                if (*(int *)&mtmp[0x1b].field_0x60 != 0) {
                  pcVar6 = "partially ";
                }
                pline("Your debt is %spaid off.",pcVar6);
              }
              if ((lStack_58 == 0) || (sell_how == 2)) {
                if (bVar15) {
                  return;
                }
                if (bVar14) {
                  dropped_container(obj,mtmp,'\0');
                }
                if ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) {
                  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
                }
                subfrombill(obj,mtmp);
                return;
              }
            }
            if (((((bVar3 == '\0') && ((!bVar14 || (gltmp < 1)))) ||
                 (*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 200)) ||
                ((((obj->oclass == '\x0f' || (obj->oclass == '\x10')) || (lStack_58 == 0)) ||
                 ((obj->oclass == '\a' && (obj->oeaten != 0)))))) ||
               (((obj->otyp == 0xe5 || (obj->otyp == 0xe6)) &&
                (SBORROW8((long)obj->age,(long)objects[obj->otyp].oc_cost * 0x14) !=
                 (long)obj->age + (long)objects[obj->otyp].oc_cost * -0x14 < 0)))) {
              pcVar6 = Monnam(mtmp);
              pcVar13 = "";
              if (delta._6_1_ != false) {
                pcVar13 = " in the rest";
              }
              pline("%s seems uninterested%s.",pcVar6,pcVar13);
              if (bVar14) {
                dropped_container(obj,mtmp,'\0');
              }
              *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
            }
            else {
              lVar7 = money_cnt(mtmp->minvent);
              if (lVar7 == 0) {
                lVar7 = (lStack_58 * 9) / 10 + (long)(int)(uint)(lStack_58 < 2);
                if ((sell_how == 0) || (auto_credit != '\0')) {
                  sell_response = 'y';
                  local_69 = 'y';
                }
                else if (sell_response == 'n') {
                  local_69 = 'n';
                }
                else {
                  pcVar6 = Monnam(mtmp);
                  pline("%s cannot pay you at present.",pcVar6);
                  pcVar6 = currency(lVar7);
                  pcVar13 = doname(obj);
                  sprintf((char *)&tmpcr,"Will you accept %ld %s in credit for %s?",lVar7,pcVar6,
                          pcVar13);
                  local_69 = yn_function((char *)&tmpcr,"ynaq",'y');
                  if (local_69 == 'a') {
                    local_69 = 'y';
                    auto_credit = '\x01';
                  }
                }
                if (local_69 == 'y') {
                  pcVar6 = "You relinquish %s and acquire %ld zorkmid%s in %scredit.";
                  if (sell_how != 0) {
                    pcVar6 = "You traded %s for %ld zorkmid%s in %scredit.";
                  }
                  pcVar13 = "";
                  if (0 < (int)mtmp[0x1b].mappearance) {
                    pcVar13 = "additional ";
                  }
                  shk_names_obj(mtmp,obj,pcVar6,lVar7,pcVar13);
                  mtmp[0x1b].mappearance = mtmp[0x1b].mappearance + (int)lVar7;
                  subfrombill(obj,mtmp);
                }
                else {
                  if (local_69 == 'q') {
                    sell_response = 'n';
                  }
                  if (bVar14) {
                    dropped_container(obj,mtmp,'\0');
                  }
                  if ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) {
                    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
                  }
                  subfrombill(obj,mtmp);
                }
              }
              else {
                lVar7 = money_cnt(mtmp->minvent);
                bVar15 = lVar7 < lStack_58;
                if (bVar15) {
                  lStack_58 = lVar7;
                }
                if (sell_response == '\0') {
                  lVar7 = contained_cost(obj,mtmp,0,'\0','\0');
                  lVar8 = contained_cost(obj,mtmp,0,'\0','\x01');
                  bVar16 = lVar7 != lVar8;
                  pcVar6 = Monnam(mtmp);
                  pcVar13 = "";
                  if (bVar15) {
                    pcVar13 = " only";
                  }
                  pcVar9 = "s";
                  if (lStack_58 == 1) {
                    pcVar9 = "";
                  }
                  if (((cltmp == 0) && (gltmp != 0)) && (bVar16)) {
                    local_300 = " your items in";
                  }
                  else {
                    local_300 = "";
                    if (cltmp == 0 && gltmp != 0) {
                      local_300 = " the contents of";
                    }
                  }
                  pcVar10 = "your";
                  if ((*(uint *)&obj->field_0x4a >> 2 & 1) != 0) {
                    pcVar10 = "the";
                  }
                  pcVar11 = cxname(obj);
                  bVar15 = false;
                  if (obj->quan == 1) {
                    bVar15 = false;
                    if ((cltmp == 0) && (bVar15 = false, gltmp != 0)) {
                      bVar15 = bVar16;
                    }
                    bVar15 = (bool)(bVar15 ^ 1);
                  }
                  pcVar12 = "them";
                  if (bVar15) {
                    pcVar12 = "it";
                  }
                  sprintf((char *)&shkmoney,"%s offers%s %ld gold piece%s for%s %s %s.  Sell %s?",
                          pcVar6,pcVar13,lStack_58,pcVar9,local_300,pcVar10,pcVar11,pcVar12);
                }
                else {
                  shkmoney._0_1_ = 0;
                }
                cVar4 = sell_response;
                if (sell_response == '\0') {
                  cVar4 = yn_function((char *)&shkmoney,"ynaq",'y');
                }
                switch(cVar4) {
                case 'a':
                  sell_response = 'y';
                case 'y':
                  if (bVar14) {
                    dropped_container(obj,mtmp,'\x01');
                  }
                  if (((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) && (bVar3 == '\0')) {
                    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
                  }
                  subfrombill(obj,mtmp);
                  pay(-lStack_58,mtmp);
                  if (sell_how == 0) {
                    local_350 = "You relinquish %s and receive %ld gold piece%s in compensation.%s";
                  }
                  else {
                    bVar14 = false;
                    if ((cltmp == 0) && (bVar14 = false, gltmp != 0)) {
                      bVar14 = bVar16;
                    }
                    local_350 = "You sold %s for %ld gold piece%s.%s";
                    if (bVar14) {
                      local_350 = "You sold some items inside %s for %ld gold pieces%s.%s";
                    }
                  }
                  shk_names_obj(mtmp,obj,local_350,lStack_58,"");
                  break;
                default:
                  warning("invalid sell response");
                  break;
                case 'q':
                  sell_response = 'n';
                case 'n':
                  if (bVar14) {
                    dropped_container(obj,mtmp,'\0');
                  }
                  if ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) {
                    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
                  }
                  subfrombill(obj,mtmp);
                }
              }
            }
          }
          else {
            if (bVar15) {
              lStack_58 = (long)obj->quan;
            }
            else if (delta._6_1_ != false) {
              lStack_58 = delta._6_1_ + lStack_58;
            }
            iVar5 = *(int *)&mtmp[0x1b].mtame - (uint)(lStack_58 < 0);
            *(int *)&mtmp[0x1b].mtame = iVar5;
            if (iVar5 != 0) {
              mtmp[0x1b].mtame = '\0';
              mtmp[0x1b].m_ap_type = '\0';
              mtmp[0x1b].mfrozen = '\0';
              mtmp[0x1b].mblinded = '\0';
            }
            if (lStack_58 != 0) {
              verbalize("Thank you for your contribution to restock this recently plundered shop.");
            }
            subfrombill(obj,mtmp);
          }
        }
      }
      else {
        bVar16 = true;
        if (((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) && (bVar16 = false, bVar14)) {
          iVar5 = count_unpaid(obj->cobj);
          bVar16 = iVar5 != 0;
        }
        if (bVar14) {
          dropped_container(obj,mtmp,'\0');
          if ((*(uint *)&obj->field_0x4a >> 2 & 1) == 0) {
            *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
          }
          if (((*(uint *)&obj->field_0x4a >> 2 & 1) != 0) ||
             (iVar5 = count_unpaid(obj->cobj), iVar5 != 0)) {
            subfrombill(obj,mtmp);
          }
        }
        else {
          *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | 8;
        }
        if ((!bVar16) && (sell_how != 2)) {
          pcVar6 = Monnam(mtmp);
          pline("%s seems uninterested.",pcVar6);
        }
      }
    }
    else {
      sub_one_frombill(obj,mtmp);
    }
  }
  return;
}

Assistant:

void sellobj(struct obj *obj, xchar x, xchar y)
{
	struct monst *shkp;
	struct eshk *eshkp;
	long ltmp = 0L, cltmp = 0L, gltmp = 0L, offer;
	boolean saleitem, cgold = FALSE, container = Has_contents(obj);
	boolean isgold = (obj->oclass == COIN_CLASS);
	boolean only_partially_your_contents = FALSE;

	if (!(shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) ||
	   !inhishop(shkp)) return;
	if (!costly_spot(x, y))	return;
	if (!*u.ushops) return;

	if (obj->unpaid && !container && !isgold) {
	    sub_one_frombill(obj, shkp);
	    return;
	}
	if (container) {
		/* find the price of content before subfrombill */
		cltmp += contained_cost(obj, shkp, cltmp, TRUE, FALSE);
		/* find the value of contained gold */
		gltmp += contained_gold(obj);
		cgold = (gltmp > 0L);
	}

	saleitem = saleable(shkp, obj);
	if (!isgold && !obj->unpaid && saleitem)
	    ltmp = set_cost(obj, shkp);

	offer = ltmp + cltmp;

	/* get one case out of the way: nothing to sell, and no gold */
	if (!(isgold || cgold) &&
	   ((offer + gltmp) == 0L || sell_how == SELL_DONTSELL)) {
		boolean unpaid = (obj->unpaid ||
				  (container && count_unpaid(obj->cobj)));

		if (container) {
			dropped_container(obj, shkp, FALSE);
			if (!obj->unpaid)
			    obj->no_charge = 1;
			if (obj->unpaid || count_unpaid(obj->cobj))
			    subfrombill(obj, shkp);
		} else obj->no_charge = 1;

		if (!unpaid && (sell_how != SELL_DONTSELL))
		    pline("%s seems uninterested.", Monnam(shkp));
		return;
	}

	/* you dropped something of your own - probably want to sell it */
	rouse_shk(shkp, TRUE);	/* wake up sleeping or paralyzed shk */
	eshkp = ESHK(shkp);

	if (ANGRY(shkp)) { /* they become shop-objects, no pay */
		pline("Thank you, scum!");
		subfrombill(obj, shkp);
		return;
	}

	if (eshkp->robbed) {  /* shkp is not angry? */
		if (isgold) offer = obj->quan;
		else if (cgold) offer += cgold;
		if ((eshkp->robbed -= offer < 0L))
			eshkp->robbed = 0L;
		if (offer) verbalize(
  "Thank you for your contribution to restock this recently plundered shop.");
		subfrombill(obj, shkp);
		return;
	}

	if (isgold || cgold) {
		if (!cgold) gltmp = obj->quan;

		if (eshkp->debit >= gltmp) {
		    if (eshkp->loan) { /* you carry shop's gold */
			 if (eshkp->loan >= gltmp)
			     eshkp->loan -= gltmp;
			 else eshkp->loan = 0L;
		    }
		    eshkp->debit -= gltmp;
		    pline("Your debt is %spaid off.",
				eshkp->debit ? "partially " : "");
		} else {
		    long delta = gltmp - eshkp->debit;

		    eshkp->credit += delta;
		    if (eshkp->debit) {
			eshkp->debit = 0L;
			eshkp->loan = 0L;
			pline("Your debt is paid off.");
		    }
		    pline("%ld %s %s added to your credit.",
				delta, currency(delta), delta > 1L ? "are" : "is");
		}
		if (offer && sell_how != SELL_DONTSELL) {
		    goto move_on;
		} else {
		    if (!isgold) {
			if (container)
			    dropped_container(obj, shkp, FALSE);
			if (!obj->unpaid) obj->no_charge = 1;
			subfrombill(obj, shkp);
		    }
		    return;
		}
	}
move_on:
	if ((!saleitem && !(container && cltmp > 0L))
	   || eshkp->billct == BILLSZ
	   || obj->oclass == BALL_CLASS
	   || obj->oclass == CHAIN_CLASS || offer == 0L
	   || (obj->oclass == FOOD_CLASS && obj->oeaten)
	   || (Is_candle(obj) &&
		   obj->age < 20L * (long)objects[obj->otyp].oc_cost)) {
		pline("%s seems uninterested%s.", Monnam(shkp),
			cgold ? " in the rest" : "");
		if (container)
		    dropped_container(obj, shkp, FALSE);
		obj->no_charge = 1;
		return;
	}
        
	if (!money_cnt(shkp->minvent)) {
		char c, qbuf[BUFSZ];
		long tmpcr = ((offer * 9L) / 10L) + (offer <= 1L);

		if (sell_how == SELL_NORMAL || auto_credit) {
		    c = sell_response = 'y';
		} else if (sell_response != 'n') {
		    pline("%s cannot pay you at present.", Monnam(shkp));
		    sprintf(qbuf,
			    "Will you accept %ld %s in credit for %s?",
			    tmpcr, currency(tmpcr), doname(obj));
		    /* won't accept 'a' response here */
		    /* KLY - 3/2000 yes, we will, it's a damn nuisance
                       to have to constantly hit 'y' to sell for credit */
		    c = ynaq(qbuf);
		    if (c == 'a') {
			c = 'y';
			auto_credit = TRUE;
		    }
		} else		/* previously specified "quit" */
		    c = 'n';

		if (c == 'y') {
		    shk_names_obj(shkp, obj, (sell_how != SELL_NORMAL) ?
			    "You traded %s for %ld zorkmid%s in %scredit." :
			"You relinquish %s and acquire %ld zorkmid%s in %scredit.",
			    tmpcr,
			    (eshkp->credit > 0L) ? "additional " : "");
		    eshkp->credit += tmpcr;
		    subfrombill(obj, shkp);
		} else {
		    if (c == 'q') sell_response = 'n';
		    if (container)
			dropped_container(obj, shkp, FALSE);
		    if (!obj->unpaid) obj->no_charge = 1;
		    subfrombill(obj, shkp);
		}
	} else {
		char qbuf[BUFSZ];
                long shkmoney = money_cnt(shkp->minvent);
		boolean short_funds = (offer > shkmoney);
		if (short_funds) offer = shkmoney;
		if (!sell_response) {
		    only_partially_your_contents =
			(contained_cost(obj, shkp, 0L, FALSE, FALSE) !=
			 contained_cost(obj, shkp, 0L, FALSE, TRUE));
		    sprintf(qbuf,
			 "%s offers%s %ld gold piece%s for%s %s %s.  Sell %s?",
			    Monnam(shkp), short_funds ? " only" : "",
			    offer, plur(offer),
			    (!ltmp && cltmp && only_partially_your_contents) ?
			     " your items in" : (!ltmp && cltmp) ? " the contents of" : "",
			    obj->unpaid ? "the" : "your", cxname(obj),
			    (obj->quan == 1L &&
			    !(!ltmp && cltmp && only_partially_your_contents)) ?
			    "it" : "them");
		} else  qbuf[0] = '\0';		/* just to pacify lint */

		switch (sell_response ? sell_response : ynaq(qbuf)) {
		 case 'q':  sell_response = 'n';
		 case 'n':  if (container)
				dropped_container(obj, shkp, FALSE);
			    if (!obj->unpaid) obj->no_charge = 1;
			    subfrombill(obj, shkp);
			    break;
		 case 'a':  sell_response = 'y';
		 case 'y':  if (container)
				dropped_container(obj, shkp, TRUE);
			    if (!obj->unpaid && !saleitem) obj->no_charge = 1;
			    subfrombill(obj, shkp);
			    pay(-offer, shkp);
			    shk_names_obj(shkp, obj, (sell_how != SELL_NORMAL) ?
				    (!ltmp && cltmp && only_partially_your_contents) ?
			    	    "You sold some items inside %s for %ld gold pieces%s.%s" :
				    "You sold %s for %ld gold piece%s.%s" :
	       "You relinquish %s and receive %ld gold piece%s in compensation.%s",
				    offer, "");
			    break;
		 default:   warning("invalid sell response");
		}
	}
}